

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

bool soul::is_type<soul::AST::Block,soul::AST::Block>(pool_ptr<soul::AST::Block> *object)

{
  Block *pBVar1;
  pool_ptr<soul::AST::Block> *object_local;
  
  pBVar1 = pool_ptr<soul::AST::Block>::get(object);
  return pBVar1 != (Block *)0x0;
}

Assistant:

inline bool is_type (pool_ptr<SrcType> object)
{
    if (object.get() == nullptr)
        return false;

    if constexpr (std::is_same<TargetType, SrcType>::value)
        return true;
    else
        return dynamic_cast<TargetType*> (object.get()) != nullptr;
}